

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O3

int dprintf_formatf(void *data,_func_int_int_FILE_ptr *stream,char *format,__va_list_tag *ap_save)

{
  bool bVar1;
  byte *__nptr;
  char *pcVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  size_t *psVar11;
  uint uVar12;
  char *pcVar13;
  size_t maxlength;
  long lVar14;
  byte *pbVar15;
  int *piVar16;
  ulong *puVar17;
  undefined8 *puVar18;
  ulong uVar19;
  uint *puVar20;
  size_t sVar21;
  size_t sVar22;
  byte bVar23;
  undefined4 *puVar24;
  int iVar25;
  uint uVar26;
  char *pcVar27;
  bool bVar28;
  byte bVar29;
  char formatbuf [32];
  char work [256];
  va_stack_t vto [128];
  char *endpos [128];
  char *local_15a0;
  long local_1590;
  char *local_1570;
  long local_1568;
  __va_list_tag *local_1560;
  char local_1558 [32];
  undefined8 local_1538;
  char local_1439;
  undefined4 local_1438;
  undefined4 uStack_1434;
  undefined1 auStack_1430 [8];
  undefined8 uStack_1428;
  ulong uStack_1420;
  size_t asStack_1418 [508];
  undefined8 local_438 [129];
  
  bVar29 = *format;
  local_1538 = (byte *)format;
  if (bVar29 != 0) {
    puVar18 = local_438;
    lVar7 = 0;
    iVar25 = 0;
LAB_0055e8ee:
    pbVar15 = local_1538 + 1;
    while (bVar29 == 0x25) {
      if (*pbVar15 != 0x25) {
        iVar25 = iVar25 + 1;
        local_1560 = ap_save;
        local_1538 = pbVar15;
        lVar6 = dprintf_DollarString((char *)pbVar15,(char **)&local_1538);
        lVar8 = (long)iVar25;
        if (lVar6 != 0) {
          lVar8 = lVar6;
        }
        if (lVar7 < lVar8) {
          lVar7 = lVar8;
        }
        lVar6 = 0;
        local_1590 = 0;
        uVar26 = 0;
        local_1568 = lVar7;
        pbVar15 = local_1538;
        goto switchD_0055e98c_caseD_1;
      }
      bVar29 = pbVar15[1];
      pbVar15 = pbVar15 + 2;
      if (bVar29 == 0) goto LAB_0055ee18;
    }
    goto LAB_0055ee0e;
  }
  goto LAB_0055efc9;
switchD_0055e98c_caseD_1:
  local_1538 = pbVar15;
  __nptr = local_1538;
  bVar29 = *local_1538;
  uVar12 = bVar29 - 0x20;
  if (((0x2f < uVar12) || ((0x900003ff6c09U >> ((ulong)uVar12 & 0x3f) & 1) == 0)) &&
     ((0x12 < bVar29 - 0x68 || ((0x40211U >> (bVar29 - 0x68 & 0x1f) & 1) == 0)))) goto LAB_0055eb2f;
  pbVar15 = local_1538 + 1;
  if (bVar29 < 0x4c) {
    switch((ulong)uVar12) {
    case 0:
      uVar26 = uVar26 | 1;
      break;
    case 3:
      uVar26 = uVar26 | 8;
      break;
    case 10:
      uVar26 = uVar26 | 0x4000;
      iVar25 = iVar25 + 1;
      local_1538 = pbVar15;
      lVar7 = dprintf_DollarString((char *)pbVar15,(char **)&local_1538);
      lVar6 = (long)iVar25;
      if (lVar7 != 0) {
        lVar6 = lVar7;
      }
      pbVar15 = local_1538;
      if (local_1568 < lVar6) {
        local_1568 = lVar6;
      }
      break;
    case 0xb:
      uVar26 = uVar26 | 2;
      break;
    case 0xd:
      uVar26 = uVar26 & 0xfffffefb | 4;
      break;
    case 0xe:
      if (*pbVar15 == 0x2a) {
        uVar26 = uVar26 | 0x18000;
        local_1538 = local_1538 + 2;
        iVar25 = iVar25 + 1;
        lVar7 = dprintf_DollarString((char *)local_1538,(char **)&local_1538);
        local_1590 = (long)iVar25;
        if (lVar7 != 0) {
          local_1590 = lVar7;
        }
        pbVar15 = local_1538;
        if (local_1568 < local_1590) {
          local_1568 = local_1590;
        }
      }
      else {
        uVar26 = uVar26 | 0x8000;
        local_1538 = pbVar15;
        local_1590 = strtol((char *)pbVar15,(char **)&local_1538,10);
        pbVar15 = local_1538;
      }
      break;
    case 0x10:
      uVar26 = uVar26 | (~uVar26 & 4) << 6;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
      uVar26 = uVar26 | 0x2000;
      local_1538 = pbVar15;
      lVar6 = strtol((char *)__nptr,(char **)&local_1538,10);
      pbVar15 = local_1538;
    }
  }
  else if (bVar29 < 0x6c) {
    if (bVar29 == 0x4c) {
      uVar26 = uVar26 | 0x80;
    }
    else if (bVar29 == 0x4f) {
LAB_0055eafc:
      uVar26 = uVar26 | 0x20;
    }
    else if (bVar29 == 0x68) {
      uVar26 = uVar26 | 0x10;
    }
  }
  else {
    if (bVar29 == 0x6c) {
      if ((uVar26 & 0x20) != 0) goto LAB_0055eb05;
      goto LAB_0055eafc;
    }
    if (bVar29 == 0x71) {
LAB_0055eb05:
      uVar26 = uVar26 | 0x40;
    }
    else if (bVar29 == 0x7a) goto LAB_0055eafc;
  }
  goto switchD_0055e98c_caseD_1;
LAB_0055eb2f:
  lVar8 = lVar8 + -1;
  if (bVar29 < 0x58) {
    if (bVar29 == 0x45) {
      (&local_1438)[lVar8 * 8] = 7;
      uVar26 = uVar26 | 0x41000;
      goto LAB_0055ed55;
    }
    if (bVar29 == 0x47) {
      (&local_1438)[lVar8 * 8] = 7;
      uVar26 = uVar26 | 0x81000;
      goto LAB_0055ed55;
    }
    if (bVar29 == 0x53) {
      uVar26 = uVar26 | 8;
      goto switchD_0055eb5b_caseD_73;
    }
    goto switchD_0055eb5b_caseD_68;
  }
  switch(bVar29) {
  case 99:
    (&local_1438)[lVar8 * 8] = 3;
    uVar26 = uVar26 | 0x20000;
    break;
  case 100:
  case 0x69:
    (&local_1438)[lVar8 * 8] = 3;
    break;
  case 0x65:
    (&local_1438)[lVar8 * 8] = 7;
    uVar26 = uVar26 | 0x40000;
    break;
  case 0x66:
    (&local_1438)[lVar8 * 8] = 7;
    break;
  case 0x67:
    (&local_1438)[lVar8 * 8] = 7;
    uVar26 = uVar26 | 0x80000;
    break;
  case 0x6e:
    (&local_1438)[lVar8 * 8] = 4;
    break;
  case 0x6f:
    (&local_1438)[lVar8 * 8] = 3;
    uVar26 = uVar26 | 0x400;
    break;
  case 0x70:
    (&local_1438)[lVar8 * 8] = 2;
    break;
  case 0x73:
switchD_0055eb5b_caseD_73:
    (&local_1438)[lVar8 * 8] = 1;
    break;
  case 0x75:
    (&local_1438)[lVar8 * 8] = 3;
    uVar26 = uVar26 | 0x200;
    break;
  case 0x78:
    (&local_1438)[lVar8 * 8] = 3;
    uVar26 = uVar26 | 0xa00;
    break;
  default:
    if (bVar29 == 0x58) {
      (&local_1438)[lVar8 * 8] = 3;
      uVar26 = uVar26 | 0x1a00;
      break;
    }
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
switchD_0055eb5b_caseD_68:
    (&local_1438)[lVar8 * 8] = 0;
  }
LAB_0055ed55:
  lVar7 = lVar8 * 0x20;
  *(uint *)(auStack_1430 + lVar7 + -4) = uVar26;
  *(long *)(auStack_1430 + lVar7) = lVar6;
  (&uStack_1428)[lVar8 * 4] = local_1590;
  if ((uVar26 >> 0xe & 1) != 0) {
    lVar8 = lVar6 + -1;
    *(long *)(auStack_1430 + lVar7) = lVar8;
    lVar7 = lVar8 * 0x20;
    (&local_1438)[lVar8 * 8] = 9;
    *(undefined8 *)(auStack_1430 + lVar7 + -4) = 0;
    *(undefined8 *)(auStack_1430 + lVar7 + 4) = 0;
    *(undefined4 *)((long)&uStack_1428 + lVar7 + 4) = 0;
  }
  if ((uVar26 >> 0x10 & 1) != 0) {
    local_1590 = local_1590 + -1;
    (&uStack_1428)[lVar8 * 4] = local_1590;
    lVar7 = local_1590 * 0x20;
    (&local_1438)[local_1590 * 8] = 9;
    *(undefined8 *)(auStack_1430 + lVar7 + -4) = 0;
    *(undefined8 *)(auStack_1430 + lVar7 + 4) = 0;
    *(undefined4 *)((long)&uStack_1428 + lVar7 + 4) = 0;
  }
  *puVar18 = local_1538 + 1;
  puVar18 = puVar18 + 1;
  ap_save = local_1560;
  lVar7 = local_1568;
  pbVar15 = local_1538;
LAB_0055ee0e:
  local_1538 = pbVar15;
  bVar29 = *local_1538;
  if (bVar29 == 0) goto LAB_0055ee18;
  goto LAB_0055e8ee;
LAB_0055ee18:
  if (0 < lVar7) {
    puVar24 = &local_1438;
    lVar8 = 1;
    do {
      if ((lVar8 < lVar7) && (puVar24[8] == 9)) {
        uVar26 = ap_save->gp_offset;
        if ((ulong)uVar26 < 0x29) {
          piVar16 = (int *)((ulong)uVar26 + (long)ap_save->reg_save_area);
          ap_save->gp_offset = uVar26 + 8;
        }
        else {
          piVar16 = (int *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = piVar16 + 2;
        }
        *(long *)(puVar24 + 0xe) = (long)*piVar16;
      }
      switch(*puVar24) {
      case 0:
      case 1:
      case 2:
      case 4:
switchD_0055ee8d_caseD_0:
        uVar26 = ap_save->gp_offset;
        if ((ulong)uVar26 < 0x29) {
          puVar17 = (ulong *)((ulong)uVar26 + (long)ap_save->reg_save_area);
          ap_save->gp_offset = uVar26 + 8;
        }
        else {
          puVar17 = (ulong *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = puVar17 + 1;
        }
        uVar19 = *puVar17;
        goto LAB_0055eeb7;
      case 3:
        uVar26 = puVar24[1];
        if ((((~uVar26 & 0x240) == 0) || ((uVar26 & 0x40) != 0)) || ((~uVar26 & 0x220) == 0))
        goto switchD_0055ee8d_caseD_0;
        uVar12 = ap_save->gp_offset;
        uVar19 = (ulong)uVar12;
        if ((uVar26 & 0x20) == 0) {
          if ((uVar26 >> 9 & 1) == 0) {
            if (uVar12 < 0x29) {
              piVar16 = (int *)(uVar19 + (long)ap_save->reg_save_area);
              ap_save->gp_offset = uVar12 + 8;
            }
            else {
              piVar16 = (int *)ap_save->overflow_arg_area;
              ap_save->overflow_arg_area = piVar16 + 2;
            }
            uVar19 = (ulong)*piVar16;
          }
          else {
            if (uVar12 < 0x29) {
              puVar20 = (uint *)(uVar19 + (long)ap_save->reg_save_area);
              ap_save->gp_offset = uVar12 + 8;
            }
            else {
              puVar20 = (uint *)ap_save->overflow_arg_area;
              ap_save->overflow_arg_area = puVar20 + 2;
            }
            uVar19 = (ulong)*puVar20;
          }
        }
        else {
          if (uVar12 < 0x29) {
            puVar17 = (ulong *)(uVar19 + (long)ap_save->reg_save_area);
            ap_save->gp_offset = uVar12 + 8;
          }
          else {
            puVar17 = (ulong *)ap_save->overflow_arg_area;
            ap_save->overflow_arg_area = puVar17 + 1;
          }
          uVar19 = *puVar17;
        }
LAB_0055eeb7:
        *(ulong *)(puVar24 + 6) = uVar19;
        break;
      case 7:
        uVar26 = ap_save->fp_offset;
        if ((ulong)uVar26 < 0xa1) {
          puVar18 = (undefined8 *)((ulong)uVar26 + (long)ap_save->reg_save_area);
          ap_save->fp_offset = uVar26 + 0x10;
        }
        else {
          puVar18 = (undefined8 *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = puVar18 + 1;
        }
        *(undefined8 *)(puVar24 + 6) = *puVar18;
        break;
      case 9:
        *puVar24 = 3;
      }
      puVar24 = puVar24 + 8;
      bVar28 = lVar8 != lVar7;
      lVar8 = lVar8 + 1;
    } while (bVar28);
  }
LAB_0055efc9:
  pcVar27 = "0123456789abcdefghijklmnopqrstuvwxyz";
  puVar18 = local_438;
  local_1568 = 0;
  local_1570 = format;
  iVar25 = 0;
  do {
    pcVar13 = local_1570;
    pcVar2 = local_1570;
    while( true ) {
      while (local_1570 = pcVar2, cVar3 = *pcVar13, cVar3 != '%') {
        if (cVar3 == '\0') {
          return iVar25;
        }
        do {
          iVar4 = (*stream)((int)cVar3,(FILE *)data);
          if (iVar4 == -1) {
            return iVar25;
          }
          iVar25 = iVar25 + 1;
          cVar3 = pcVar13[1];
          pcVar13 = pcVar13 + 1;
          pcVar2 = pcVar13;
        } while ((cVar3 != '\0') && (cVar3 != '%'));
      }
      local_1570 = pcVar13 + 1;
      if (pcVar13[1] != '%') break;
      pcVar13 = pcVar13 + 2;
      local_1570 = pcVar13;
      iVar4 = (*stream)(0x25,(FILE *)data);
      if (iVar4 == -1) {
        return iVar25;
      }
      iVar25 = iVar25 + 1;
      pcVar2 = local_1570;
    }
    lVar8 = dprintf_DollarString(local_1570,&local_1570);
    lVar7 = lVar8 + -1;
    if (lVar8 == 0) {
      lVar7 = local_1568;
    }
    lVar8 = lVar7 * 0x20;
    psVar11 = (size_t *)(auStack_1430 + lVar8);
    uVar26 = *(uint *)(auStack_1430 + lVar8 + -4);
    if ((uVar26 >> 0xe & 1) != 0) {
      psVar11 = asStack_1418 + *psVar11 * 4 + -1;
    }
    sVar10 = *psVar11;
    if ((uVar26 >> 0x10 & 1) == 0) {
      local_1568 = local_1568 + 1;
      sVar21 = 0xffffffffffffffff;
      if ((short)uVar26 < 0) {
        sVar21 = (&uStack_1428)[lVar7 * 4];
      }
    }
    else {
      sVar21 = asStack_1418[(&uStack_1428)[lVar7 * 4] * 4 + -1];
      local_1568 = local_1568 + 2;
    }
    iVar4 = (int)sVar10;
    iVar5 = iVar25;
    switch((&local_1438)[lVar7 * 8]) {
    case 1:
      local_15a0 = (char *)asStack_1418[lVar7 * 4 + -1];
      if (local_15a0 == (char *)0x0) {
        if (sVar21 == 0xffffffffffffffff || 4 < (long)sVar21) {
          uVar26 = uVar26 & 0xfffffff7;
          *(uint *)(auStack_1430 + lVar8 + -4) = uVar26;
          sVar21 = 5;
          local_15a0 = "(nil)";
        }
        else {
          local_15a0 = "";
          sVar21 = 0;
        }
      }
      else if (sVar21 == 0xffffffffffffffff) {
        sVar21 = strlen(local_15a0);
      }
      if ((uVar26 & 8) != 0) {
        iVar5 = (*stream)(0x22,(FILE *)data);
        if (iVar5 == -1) {
          return iVar25;
        }
        iVar25 = iVar25 + 1;
        uVar26 = *(uint *)(auStack_1430 + lVar8 + -4);
      }
      lVar7 = sVar10 - sVar21;
      if ((uVar26 & 4) == 0) {
        if (lVar7 < 1) {
          lVar7 = lVar7 + -1;
        }
        else {
          iVar4 = iVar4 + iVar25;
          do {
            iVar5 = (*stream)(0x20,(FILE *)data);
            if (iVar5 == -1) {
              return iVar25;
            }
            iVar25 = iVar25 + 1;
            lVar6 = lVar7 + -1;
            bVar28 = 0 < lVar7;
            lVar7 = lVar6;
          } while (lVar6 != 0 && bVar28);
          lVar7 = -1;
          iVar25 = iVar4 - (int)sVar21;
        }
      }
      if (sVar21 != 0) {
        sVar10 = 0;
        do {
          iVar4 = (int)sVar10;
          if (local_15a0[sVar10] == '\0') break;
          iVar4 = (*stream)((int)local_15a0[sVar10],(FILE *)data);
          if (iVar4 == -1) {
            return iVar25 + (int)sVar10;
          }
          sVar10 = sVar10 + 1;
          iVar4 = (int)sVar21;
        } while (sVar21 != sVar10);
        iVar25 = iVar25 + iVar4;
      }
      uVar26 = *(uint *)(auStack_1430 + lVar8 + -4);
      if (((uVar26 & 4) != 0) && (0 < lVar7)) {
        iVar4 = iVar25 + (int)lVar7;
        lVar7 = lVar7 + 1;
        do {
          iVar5 = (*stream)(0x20,(FILE *)data);
          if (iVar5 == -1) {
            return iVar25;
          }
          iVar25 = iVar25 + 1;
          lVar7 = lVar7 + -1;
        } while (1 < lVar7);
        uVar26 = *(uint *)(auStack_1430 + lVar8 + -4);
        iVar25 = iVar4;
      }
      iVar5 = iVar25;
      if ((uVar26 & 8) != 0) {
        iVar4 = (*stream)(0x22,(FILE *)data);
        if (iVar4 == -1) {
          return iVar25;
        }
        iVar5 = iVar25 + 1;
      }
      break;
    case 2:
      sVar22 = asStack_1418[lVar7 * 4 + -1];
      if (sVar22 == 0) {
        if ((uVar26 & 4) == 0) {
          lVar7 = sVar10 - 5;
        }
        else if ((long)sVar10 < 6) {
          lVar7 = sVar10 - 6;
        }
        else {
          iVar4 = iVar25 + iVar4;
          lVar7 = sVar10 - 5;
          do {
            iVar5 = (*stream)(0x20,(FILE *)data);
            if (iVar5 == -1) {
              return iVar25;
            }
            iVar25 = iVar25 + 1;
            lVar7 = lVar7 + -1;
          } while (0 < lVar7);
          lVar7 = -1;
          iVar25 = iVar4 + -5;
        }
        iVar4 = iVar25 + 5;
        cVar3 = '(';
        lVar6 = 0;
        do {
          iVar5 = (*stream)((int)cVar3,(FILE *)data);
          if (iVar5 == -1) {
            return iVar25 + (int)lVar6;
          }
          cVar3 = "(nil)"[lVar6 + 1];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 5);
        iVar5 = iVar4;
        if (((auStack_1430[lVar8 + -4] & 4) == 0) && (0 < lVar7)) {
          iVar5 = iVar4 + (int)lVar7;
          lVar7 = lVar7 + 1;
          do {
            iVar25 = (*stream)(0x20,(FILE *)data);
            if (iVar25 == -1) {
              return iVar4;
            }
            iVar4 = iVar4 + 1;
            lVar7 = lVar7 + -1;
          } while (1 < lVar7);
        }
      }
      else {
        pcVar27 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
        if ((uVar26 >> 0xc & 1) == 0) {
          pcVar27 = "0123456789abcdefghijklmnopqrstuvwxyz";
        }
        uVar12 = 1;
LAB_0055f1d5:
        bVar29 = true;
        uVar19 = 0x10;
        bVar28 = false;
        bVar23 = 1;
LAB_0055f48b:
        if (sVar21 == 0xffffffffffffffff) {
          sVar21 = 1;
        }
        lVar7 = 0xff;
        if (sVar22 == 0) {
          pcVar13 = &local_1439;
        }
        else {
          do {
            lVar6 = lVar7;
            *(char *)((long)&local_1538 + lVar6) = pcVar27[sVar22 % uVar19];
            lVar7 = lVar6 + -1;
            bVar1 = uVar19 <= sVar22;
            sVar22 = sVar22 / uVar19;
          } while (bVar1);
          pcVar13 = local_1558 + lVar6 + 0x1f;
        }
        lVar6 = sVar10 - (0xff - lVar7);
        sVar10 = sVar21 - (0xff - lVar7);
        if ((bVar28 && uVar12 != 0) && ((long)sVar10 < 1)) {
          lVar7 = lVar7 + -1;
          *pcVar13 = '0';
          lVar6 = lVar6 + -1;
        }
        else if (0 < (long)sVar10) {
          local_1560 = (__va_list_tag *)CONCAT71(local_1560._1_7_,bVar29);
          memset((void *)((long)&local_1438 - sVar21),0x30,sVar10);
          lVar6 = lVar6 - sVar10;
          lVar7 = 0xff - sVar21;
          bVar29 = (byte)local_1560;
        }
        bVar23 = (byte)uVar12 & bVar23;
        lVar14 = lVar6 + -2;
        if (bVar23 == 0) {
          lVar14 = lVar6;
        }
        lVar14 = lVar14 - (ulong)(byte)(bVar29 ^ 1 | (uVar26 & 3) != 0);
        if ((uVar26 & 0x104) == 0) {
          if (lVar14 < 1) {
            lVar14 = lVar14 + -1;
          }
          else {
            local_1560 = (__va_list_tag *)CONCAT71(local_1560._1_7_,bVar29);
            iVar4 = iVar25 + (int)lVar14;
            do {
              iVar5 = (*stream)(0x20,(FILE *)data);
              if (iVar5 == -1) {
                return iVar25;
              }
              iVar25 = iVar25 + 1;
              lVar6 = lVar14 + -1;
              bVar28 = 0 < lVar14;
              lVar14 = lVar6;
            } while (lVar6 != 0 && bVar28);
            lVar14 = -1;
            bVar29 = (byte)local_1560;
            iVar25 = iVar4;
          }
        }
        if (bVar29 == 0) {
          iVar4 = 0x2d;
LAB_0055f617:
          iVar4 = (*stream)(iVar4,(FILE *)data);
          if (iVar4 == -1) {
            return iVar25;
          }
          iVar25 = iVar25 + 1;
        }
        else {
          if ((*(uint *)(auStack_1430 + lVar8 + -4) & 2) != 0) {
            iVar4 = 0x2b;
            goto LAB_0055f617;
          }
          if ((*(uint *)(auStack_1430 + lVar8 + -4) & 1) != 0) {
            iVar4 = 0x20;
            goto LAB_0055f617;
          }
        }
        if (bVar23 != 0) {
          iVar4 = (*stream)(0x30,(FILE *)data);
          if (iVar4 == -1) {
            return iVar25;
          }
          if ((auStack_1430[lVar8 + -3] & 0x10) == 0) {
            iVar4 = 0x78;
          }
          else {
            iVar4 = 0x58;
          }
          iVar4 = (*stream)(iVar4,(FILE *)data);
          if (iVar4 == -1) {
            return iVar25 + 1;
          }
          iVar25 = iVar25 + 2;
        }
        if ((*(uint *)(auStack_1430 + lVar8 + -4) & 0x104) == 0x100) {
          if (lVar14 < 1) {
            lVar14 = lVar14 + -1;
          }
          else {
            iVar4 = iVar25 + (int)lVar14;
            do {
              iVar5 = (*stream)(0x30,(FILE *)data);
              if (iVar5 == -1) {
                return iVar25;
              }
              iVar25 = iVar25 + 1;
              lVar6 = lVar14 + -1;
              bVar28 = 0 < lVar14;
              lVar14 = lVar6;
            } while (lVar6 != 0 && bVar28);
            lVar14 = -1;
            iVar25 = iVar4;
          }
        }
        iVar4 = iVar25;
        if (lVar7 < 0xff) {
          iVar5 = iVar25 - (int)lVar7;
          do {
            iVar4 = (*stream)((int)*(undefined1 *)((long)&local_1538 + lVar7 + 1),(FILE *)data);
            if (iVar4 == -1) {
              return iVar25;
            }
            lVar7 = lVar7 + 1;
            iVar25 = iVar25 + 1;
            iVar4 = iVar5 + 0xff;
          } while (lVar7 != 0xff);
        }
        iVar5 = iVar4;
        if (((auStack_1430[lVar8 + -4] & 4) != 0) && (0 < lVar14)) {
          iVar5 = iVar4 + (int)lVar14;
          lVar14 = lVar14 + 1;
          do {
            iVar25 = (*stream)(0x20,(FILE *)data);
            if (iVar25 == -1) {
              return iVar4;
            }
            iVar4 = iVar4 + 1;
            lVar14 = lVar14 + -1;
          } while (1 < lVar14);
        }
      }
      break;
    case 3:
      sVar22 = asStack_1418[lVar7 * 4 + -1];
      if ((uVar26 >> 0x11 & 1) == 0) {
        uVar12 = uVar26 >> 3 & 1;
        bVar29 = true;
        if ((uVar26 >> 10 & 1) == 0) {
          if ((uVar26 >> 0xb & 1) != 0) {
            pcVar27 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
            if ((uVar26 >> 0xc & 1) == 0) {
              pcVar27 = "0123456789abcdefghijklmnopqrstuvwxyz";
            }
            goto LAB_0055f1d5;
          }
          uVar19 = 10;
          if ((uVar26 >> 9 & 1) == 0) {
            sVar9 = -sVar22;
            if (0 < (long)sVar22) {
              sVar9 = sVar22;
            }
            bVar29 = -1 < (long)sVar22;
            bVar28 = false;
            bVar23 = 0;
            sVar22 = sVar9;
          }
          else {
            bVar28 = false;
            bVar23 = 0;
          }
        }
        else {
          uVar19 = 8;
          bVar23 = 0;
          bVar28 = true;
        }
        goto LAB_0055f48b;
      }
      if ((uVar26 & 4) == 0) {
        if ((long)sVar10 < 2) {
          sVar10 = sVar10 - 1;
        }
        else {
          iVar4 = iVar25 + iVar4;
          do {
            iVar5 = (*stream)(0x20,(FILE *)data);
            if (iVar5 == -1) {
              return iVar25;
            }
            iVar25 = iVar25 + 1;
            sVar10 = sVar10 - 1;
          } while (1 < (long)sVar10);
          sVar10 = 0;
          iVar25 = iVar4 + -1;
        }
      }
      iVar4 = (*stream)((uint)sVar22 & 0xff,(FILE *)data);
      if (iVar4 == -1) {
        return iVar25;
      }
      iVar4 = iVar25 + 1;
      iVar5 = iVar4;
      if (((auStack_1430[lVar8 + -4] & 4) != 0) && (1 < (long)sVar10)) {
        lVar7 = sVar10 + 1;
        do {
          iVar5 = (*stream)(0x20,(FILE *)data);
          if (iVar5 == -1) {
            return iVar4;
          }
          iVar4 = iVar4 + 1;
          lVar7 = lVar7 + -1;
          iVar5 = iVar25 + (int)sVar10;
        } while (2 < lVar7);
      }
      break;
    case 4:
      if ((uVar26 & 0x40) != 0) {
        *(long *)asStack_1418[lVar7 * 4 + -1] = (long)iVar25;
        goto switchD_0055f10d_caseD_5;
      }
      if ((uVar26 & 0x20) == 0) {
        if ((uVar26 & 0x10) == 0) {
          *(int *)asStack_1418[lVar7 * 4 + -1] = iVar25;
        }
        else {
          *(short *)asStack_1418[lVar7 * 4 + -1] = (short)iVar25;
        }
      }
      else {
        *(long *)asStack_1418[lVar7 * 4 + -1] = (long)iVar25;
      }
      break;
    default:
switchD_0055f10d_caseD_5:
      break;
    case 7:
      local_1558[0x10] = '\0';
      local_1558[0x11] = '\0';
      local_1558[0x12] = '\0';
      local_1558[0x13] = '\0';
      local_1558[0x14] = '\0';
      local_1558[0x15] = '\0';
      local_1558[0x16] = '\0';
      local_1558[0x17] = '\0';
      local_1558[0x18] = '\0';
      local_1558[0x19] = '\0';
      local_1558[0x1a] = '\0';
      local_1558[0x1b] = '\0';
      local_1558[0x1c] = '\0';
      local_1558[0x1d] = '\0';
      local_1558[0x1e] = '\0';
      local_1558[0x1f] = '\0';
      local_1558[0] = '%';
      local_1558[1] = '\0';
      local_1558[2] = '\0';
      local_1558[3] = '\0';
      local_1558[4] = '\0';
      local_1558[5] = '\0';
      local_1558[6] = '\0';
      local_1558[7] = '\0';
      local_1558[8] = '\0';
      local_1558[9] = '\0';
      local_1558[10] = '\0';
      local_1558[0xb] = '\0';
      local_1558[0xc] = '\0';
      local_1558[0xd] = '\0';
      local_1558[0xe] = '\0';
      local_1558[0xf] = '\0';
      sVar10 = strlen(local_1558);
      if ((uVar26 >> 0xd & 1) == 0) {
        sVar21 = 0xffffffffffffffff;
        if ((uVar26 >> 0xe & 1) != 0) {
          psVar11 = asStack_1418 + *(long *)(auStack_1430 + lVar8) * 4 + -1;
          goto LAB_0055f2e3;
        }
      }
      else {
        psVar11 = (size_t *)(auStack_1430 + lVar8);
LAB_0055f2e3:
        sVar21 = *psVar11;
      }
      if ((short)uVar26 < 0) {
        psVar11 = &uStack_1428 + lVar7 * 4;
LAB_0055f312:
        sVar22 = *psVar11;
      }
      else {
        sVar22 = 0xffffffffffffffff;
        if ((uVar26 >> 0x10 & 1) != 0) {
          psVar11 = asStack_1418 + (&uStack_1428)[lVar7 * 4] * 4 + -1;
          goto LAB_0055f312;
        }
      }
      pbVar15 = (byte *)(local_1558 + 1);
      if ((uVar26 & 4) != 0) {
        local_1558[1] = 0x2d;
        pbVar15 = (byte *)(local_1558 + 2);
      }
      if ((uVar26 & 2) != 0) {
        *pbVar15 = 0x2b;
        pbVar15 = pbVar15 + 1;
      }
      if ((uVar26 & 1) != 0) {
        *pbVar15 = 0x20;
        pbVar15 = pbVar15 + 1;
        uVar26 = *(uint *)(auStack_1430 + lVar8 + -4);
      }
      if ((uVar26 & 8) != 0) {
        *pbVar15 = 0x23;
        pbVar15 = pbVar15 + 1;
      }
      maxlength = 0x20 - sVar10;
      *pbVar15 = 0;
      if (-1 < (long)sVar21) {
        iVar4 = curl_msnprintf((char *)pbVar15,maxlength,"%ld");
        pbVar15 = pbVar15 + iVar4;
        maxlength = maxlength - (long)iVar4;
      }
      if (-1 < (long)sVar22) {
        iVar4 = curl_msnprintf((char *)pbVar15,maxlength,".%ld",sVar22);
        pbVar15 = pbVar15 + iVar4;
      }
      uVar26 = *(uint *)(auStack_1430 + lVar8 + -4);
      if ((uVar26 & 0x20) != 0) {
        *pbVar15 = 0x6c;
        pbVar15 = pbVar15 + 1;
        uVar26 = *(uint *)(auStack_1430 + lVar8 + -4);
      }
      if ((uVar26 >> 0x12 & 1) == 0) {
        bVar29 = 0x66;
        if ((uVar26 >> 0x13 & 1) != 0) {
          bVar29 = ((uVar26 >> 0xc & 1) == 0) << 5 | 0x47;
        }
      }
      else {
        bVar29 = ((uVar26 >> 0xc & 1) == 0) << 5 | 0x45;
      }
      *pbVar15 = bVar29;
      pbVar15[1] = 0;
      sprintf((char *)&local_1538,local_1558,(int)asStack_1418[lVar7 * 4 + -1]);
      pcVar13 = (char *)((long)&local_1538 + 1);
      cVar3 = (char)local_1538;
      while (iVar5 = iVar25, cVar3 != '\0') {
        iVar4 = (*stream)((int)cVar3,(FILE *)data);
        if (iVar4 == -1) {
          return iVar25;
        }
        iVar25 = iVar25 + 1;
        cVar3 = *pcVar13;
        pcVar13 = pcVar13 + 1;
      }
    }
    local_1570 = (char *)*puVar18;
    puVar18 = puVar18 + 1;
    iVar25 = iVar5;
  } while( true );
}

Assistant:

static int dprintf_formatf(
  void *data, /* untouched by format(), just sent to the stream() function in
                 the second argument */
  /* function pointer called for each output character */
  int (*stream)(int, FILE *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  /* Base-36 digits for numbers.  */
  const char *digits = lower_digits;

  /* Pointer into the format string.  */
  char *f;

  /* Number of characters written.  */
  int done = 0;

  long param; /* current parameter to read */
  long param_num=0; /* parameter counter */

  va_stack_t vto[MAX_PARAMETERS];
  char *endpos[MAX_PARAMETERS];
  char **end;

  char work[BUFFSIZE];

  va_stack_t *p;

  /* Do the actual %-code parsing */
  dprintf_Pass1(format, vto, endpos, ap_save);

  end = &endpos[0]; /* the initial end-position from the list dprintf_Pass1()
                       created for us */

  f = (char *)format;
  while(*f != '\0') {
    /* Format spec modifiers.  */
    int is_alt;

    /* Width of a field.  */
    long width;

    /* Precision of a field.  */
    long prec;

    /* Decimal integer is negative.  */
    int is_neg;

    /* Base of a number to be written.  */
    long base;

    /* Integral values to be written.  */
    mp_uintmax_t num;

    /* Used to convert negative in positive.  */
    mp_intmax_t signed_num;

    if(*f != '%') {
      /* This isn't a format spec, so write everything out until the next one
         OR end of string is reached.  */
      do {
        OUTCHAR(*f);
      } while(*++f && ('%' != *f));
      continue;
    }

    ++f;

    /* Check for "%%".  Note that although the ANSI standard lists
       '%' as a conversion specifier, it says "The complete format
       specification shall be `%%'," so we can avoid all the width
       and precision processing.  */
    if(*f == '%') {
      ++f;
      OUTCHAR('%');
      continue;
    }

    /* If this is a positional parameter, the position must follow immediately
       after the %, thus create a %<num>$ sequence */
    param=dprintf_DollarString(f, &f);

    if(!param)
      param = param_num;
    else
      --param;

    param_num++; /* increase this always to allow "%2$s %1$s %s" and then the
                    third %s will pick the 3rd argument */

    p = &vto[param];

    /* pick up the specified width */
    if(p->flags & FLAGS_WIDTHPARAM)
      width = (long)vto[p->width].data.num.as_signed;
    else
      width = p->width;

    /* pick up the specified precision */
    if(p->flags & FLAGS_PRECPARAM) {
      prec = (long)vto[p->precision].data.num.as_signed;
      param_num++; /* since the precision is extraced from a parameter, we
                      must skip that to get to the next one properly */
    }
    else if(p->flags & FLAGS_PREC)
      prec = p->precision;
    else
      prec = -1;

    is_alt = (p->flags & FLAGS_ALT) ? 1 : 0;

    switch (p->type) {
    case FORMAT_INT:
      num = p->data.num.as_unsigned;
      if(p->flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(p->flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(p->flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(p->flags & FLAGS_OCTAL) {
        /* Octal unsigned integer.  */
        base = 8;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer.  */

        digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
        base = 16;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer.  */
        base = 10;
        goto unsigned_number;
      }

      /* Decimal integer.  */
      base = 10;

      is_neg = (p->data.num.as_signed < (mp_intmax_t)0) ? 1 : 0;
      if(is_neg) {
        /* signed_num might fail to hold absolute negative minimum by 1 */
        signed_num = p->data.num.as_signed + (mp_intmax_t)1;
        signed_num = -signed_num;
        num = (mp_uintmax_t)signed_num;
        num += (mp_uintmax_t)1;
      }

      goto number;

      unsigned_number:
      /* Unsigned number of base BASE.  */
      is_neg = 0;

      number:
      /* Number of base BASE.  */
      {
        char *workend = &work[sizeof(work) - 1];
        char *w;

        /* Supply a default precision if none was given.  */
        if(prec == -1)
          prec = 1;

        /* Put the number in WORK.  */
        w = workend;
        while(num > 0) {
          *w-- = digits[num % base];
          num /= base;
        }
        width -= (long)(workend - w);
        prec -= (long)(workend - w);

        if(is_alt && base == 8 && prec <= 0) {
          *w-- = '0';
          --width;
        }

        if(prec > 0) {
          width -= prec;
          while(prec-- > 0)
            *w-- = '0';
        }

        if(is_alt && base == 16)
          width -= 2;

        if(is_neg || (p->flags & FLAGS_SHOWSIGN) || (p->flags & FLAGS_SPACE))
          --width;

        if(!(p->flags & FLAGS_LEFT) && !(p->flags & FLAGS_PAD_NIL))
          while(width-- > 0)
            OUTCHAR(' ');

        if(is_neg)
          OUTCHAR('-');
        else if(p->flags & FLAGS_SHOWSIGN)
          OUTCHAR('+');
        else if(p->flags & FLAGS_SPACE)
          OUTCHAR(' ');

        if(is_alt && base == 16) {
          OUTCHAR('0');
          if(p->flags & FLAGS_UPPER)
            OUTCHAR('X');
          else
            OUTCHAR('x');
        }

        if(!(p->flags & FLAGS_LEFT) && (p->flags & FLAGS_PAD_NIL))
          while(width-- > 0)
            OUTCHAR('0');

        /* Write the number.  */
        while(++w <= workend) {
          OUTCHAR(*w);
        }

        if(p->flags & FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');
      }
      break;

    case FORMAT_STRING:
            /* String.  */
      {
        static const char null[] = "(nil)";
        const char *str;
        size_t len;

        str = (char *) p->data.str;
        if(str == NULL) {
          /* Write null[] if there's space.  */
          if(prec == -1 || prec >= (long) sizeof(null) - 1) {
            str = null;
            len = sizeof(null) - 1;
            /* Disable quotes around (nil) */
            p->flags &= (~FLAGS_ALT);
          }
          else {
            str = "";
            len = 0;
          }
        }
        else if(prec != -1)
          len = (size_t)prec;
        else
          len = strlen(str);

        width -= (long)len;

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');

        if(!(p->flags&FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');

        while((len-- > 0) && *str)
          OUTCHAR(*str++);
        if(p->flags&FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');
      }
      break;

    case FORMAT_PTR:
      /* Generic pointer.  */
      {
        void *ptr;
        ptr = (void *) p->data.ptr;
        if(ptr != NULL) {
          /* If the pointer is not NULL, write it as a %#x spec.  */
          base = 16;
          digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
          is_alt = 1;
          num = (size_t) ptr;
          is_neg = 0;
          goto number;
        }
        else {
          /* Write "(nil)" for a nil pointer.  */
          static const char strnil[] = "(nil)";
          const char *point;

          width -= (long)(sizeof(strnil) - 1);
          if(p->flags & FLAGS_LEFT)
            while(width-- > 0)
              OUTCHAR(' ');
          for(point = strnil; *point != '\0'; ++point)
            OUTCHAR(*point);
          if(! (p->flags & FLAGS_LEFT))
            while(width-- > 0)
              OUTCHAR(' ');
        }
      }
      break;

    case FORMAT_DOUBLE:
      {
        char formatbuf[32]="%";
        char *fptr = &formatbuf[1];
        size_t left = sizeof(formatbuf)-strlen(formatbuf);
        int len;

        width = -1;
        if(p->flags & FLAGS_WIDTH)
          width = p->width;
        else if(p->flags & FLAGS_WIDTHPARAM)
          width = (long)vto[p->width].data.num.as_signed;

        prec = -1;
        if(p->flags & FLAGS_PREC)
          prec = p->precision;
        else if(p->flags & FLAGS_PRECPARAM)
          prec = (long)vto[p->precision].data.num.as_signed;

        if(p->flags & FLAGS_LEFT)
          *fptr++ = '-';
        if(p->flags & FLAGS_SHOWSIGN)
          *fptr++ = '+';
        if(p->flags & FLAGS_SPACE)
          *fptr++ = ' ';
        if(p->flags & FLAGS_ALT)
          *fptr++ = '#';

        *fptr = 0;

        if(width >= 0) {
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, "%ld", width);
          fptr += len;
          left -= len;
        }
        if(prec >= 0) {
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, ".%ld", prec);
          fptr += len;
        }
        if(p->flags & FLAGS_LONG)
          *fptr++ = 'l';

        if(p->flags & FLAGS_FLOATE)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'E':'e');
        else if(p->flags & FLAGS_FLOATG)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'G' : 'g');
        else
          *fptr++ = 'f';

        *fptr = 0; /* and a final zero termination */

        /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
           output characters */
        (sprintf)(work, formatbuf, p->data.dnum);

        for(fptr=work; *fptr; fptr++)
          OUTCHAR(*fptr);
      }
      break;

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(p->flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) p->data.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(p->flags & FLAGS_LONG)
          *(long *) p->data.ptr = (long)done;
      else if(!(p->flags & FLAGS_SHORT))
        *(int *) p->data.ptr = (int)done;
      else
        *(short *) p->data.ptr = (short)done;
      break;

    default:
      break;
    }
    f = *end++; /* goto end of %-code */

  }
  return done;
}